

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O0

mg_local_time * mg_local_time_copy_ca(mg_local_time *src,mg_allocator *allocator)

{
  mg_allocator *in_RSI;
  int64_t *in_RDI;
  mg_local_time *local_time;
  mg_local_time *local_8;
  
  if (in_RDI == (int64_t *)0x0) {
    local_8 = (mg_local_time *)0x0;
  }
  else {
    local_8 = mg_local_time_alloc(in_RSI);
    if (local_8 == (mg_local_time *)0x0) {
      local_8 = (mg_local_time *)0x0;
    }
    else {
      local_8->nanoseconds = *in_RDI;
    }
  }
  return local_8;
}

Assistant:

mg_local_time *mg_local_time_copy_ca(const mg_local_time *src,
                                     mg_allocator *allocator) {
  if (!src) {
    return NULL;
  }
  mg_local_time *local_time = mg_local_time_alloc(allocator);
  if (!local_time) {
    return NULL;
  }
  memcpy(local_time, src, sizeof(mg_local_time));
  return local_time;
}